

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_get_system_colors.cxx
# Opt level: O0

void getsyscolor(char *key1,char *key2,char *arg,char *defarg,_func_void_uchar_uchar_uchar *func)

{
  int iVar1;
  undefined1 local_40 [8];
  XColor x;
  _func_void_uchar_uchar_uchar *func_local;
  char *defarg_local;
  char *arg_local;
  char *key2_local;
  char *key1_local;
  
  x._8_8_ = func;
  defarg_local = arg;
  if ((arg == (char *)0x0) &&
     (defarg_local = (char *)XGetDefault(fl_display,key1,key2), defarg_local == (char *)0x0)) {
    defarg_local = defarg;
  }
  iVar1 = XParseColor(fl_display,fl_colormap,defarg_local,local_40);
  if (iVar1 == 0) {
    (*Fl::error)("Unknown color: %s",defarg_local);
  }
  else {
    (*(code *)x._8_8_)(x.pixel._1_1_,x.pixel._3_1_,x.pixel._5_1_);
  }
  return;
}

Assistant:

static void
getsyscolor(const char *key1, const char* key2, const char *arg, const char *defarg, void (*func)(uchar,uchar,uchar))
{
  if (!arg) {
    arg = XGetDefault(fl_display, key1, key2);
    if (!arg) arg = defarg;
  }
  XColor x;
  if (!XParseColor(fl_display, fl_colormap, arg, &x))
    Fl::error("Unknown color: %s", arg);
  else
    func(x.red>>8, x.green>>8, x.blue>>8);
}